

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::Hinge::dim_forward(Hinge *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  bool bVar1;
  size_type sVar2;
  ostream *os;
  invalid_argument *this_00;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  ostringstream s;
  Dim *in_stack_fffffffffffffdf8;
  ostringstream *this_01;
  uint b;
  Dim *this_02;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 uVar3;
  undefined1 *puVar4;
  string local_1b8 [48];
  ostringstream local_188 [376];
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  this_02 = in_RDI;
  local_10 = in_RDX;
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  b = (uint)((ulong)in_RDI >> 0x20);
  if (sVar2 == 1) {
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
    bVar1 = LooksLikeVector(in_stack_fffffffffffffdf8);
    if (bVar1) {
      uVar3 = 1;
      puVar4 = &stack0xfffffffffffffe2c;
      std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
      x._M_array._4_4_ = uVar3;
      x._M_array._0_4_ = in_stack_fffffffffffffe28;
      x._M_len = (size_type)puVar4;
      Dim::Dim(this_02,x,b);
      return this_02;
    }
  }
  this_01 = local_188;
  std::__cxx11::ostringstream::ostringstream(this_01);
  os = std::operator<<((ostream *)this_01,"Bad input dimensions in Hinge: ");
  cnn::operator<<(os,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)this_01);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Hinge::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || !LooksLikeVector(xs[0])) {
    ostringstream s; s << "Bad input dimensions in Hinge: " << xs;
    throw std::invalid_argument(s.str());
  }
  return Dim({1}, xs[0].bd);
}